

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::compute_adam_update
               (size_t begin,size_t end,tensor *s,tensor *m,tensor *v,float t,float learning_rate,
               float weight_decay,float momentum1,float momentum2,tensor *params,tensor *params_grad
               )

{
  uint *puVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar8;
  fatal_error *pfVar9;
  size_t i;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  string local_1c8;
  ostringstream dlib_o_out;
  uint auStack_190 [88];
  long lVar7;
  
  uVar2 = s->m_size;
  if ((((uVar2 == m->m_size) && (uVar2 == v->m_size)) && (uVar2 == params->m_size)) &&
     (uVar2 == params_grad->m_size)) {
    if ((begin <= end) && (end <= uVar2)) {
      fVar10 = powf(momentum2,t);
      fVar10 = 1.0 - fVar10;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      fVar11 = powf(momentum1,t);
      iVar3 = (*m->_vptr_tensor[3])(m);
      lVar7 = CONCAT44(extraout_var,iVar3);
      iVar3 = (*v->_vptr_tensor[3])(v);
      iVar4 = (*s->_vptr_tensor[4])(s);
      iVar5 = (*params->_vptr_tensor[2])(params);
      iVar6 = (*params_grad->_vptr_tensor[2])();
      for (; end != begin; begin = begin + 1) {
        fVar12 = *(float *)(CONCAT44(extraout_var_02,iVar5) + begin * 4) * weight_decay +
                 *(float *)(CONCAT44(extraout_var_03,iVar6) + begin * 4);
        *(float *)(lVar7 + begin * 4) =
             *(float *)(lVar7 + begin * 4) * momentum1 + (1.0 - momentum1) * fVar12;
        fVar13 = *(float *)(CONCAT44(extraout_var_00,iVar3) + begin * 4) * momentum2 +
                 (1.0 - momentum2) * fVar12 * fVar12;
        *(float *)(CONCAT44(extraout_var_00,iVar3) + begin * 4) = fVar13;
        fVar12 = *(float *)(lVar7 + begin * 4);
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        *(float *)(CONCAT44(extraout_var_01,iVar4) + begin * 4) =
             (fVar12 * ((-fVar10 * learning_rate) / (1.0 - fVar11))) / (fVar13 + 1e-08);
      }
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x26f);
    std::operator<<(poVar8,".\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar8,".\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar8 = std::operator<<(poVar8,
                             "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar8,".\n\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar8 = std::operator<<(poVar8,"begin <= end && end <= params.size()");
    std::operator<<(poVar8,".\n");
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar8,"\n");
    pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x26e);
  std::operator<<(poVar8,".\n");
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar8 = std::operator<<(poVar8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar8,".\n");
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar8 = std::operator<<(poVar8,
                           "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar8,".\n\n");
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar8 = std::operator<<(poVar8,
                           "s.size() == m.size() && s.size() == v.size() && s.size() == params.size() && s.size() == params_grad.size()"
                          );
  std::operator<<(poVar8,".\n");
  puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar8 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar8,"\n");
  pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
}

Assistant:

void compute_adam_update (
            size_t begin,
            size_t end,
            tensor& s,
            tensor& m,
            tensor& v,
            const float t,
            const float learning_rate,
            const float weight_decay,
            const float momentum1,
            const float momentum2,
            const tensor& params,
            const tensor& params_grad
        )
        {
            DLIB_CASSERT(s.size() == m.size() &&
                         s.size() == v.size() &&
                         s.size() == params.size() &&
                         s.size() == params_grad.size());
            DLIB_CASSERT(begin <= end && end <= params.size());
            const float eps = 1e-8;
            const float alpha = learning_rate*std::sqrt(1-std::pow(momentum2,t))/(1-std::pow(momentum1, t));

            // The loop is equivalent to doing this:
            //   m = momentum1*m + (1-momentum1)    *   (weight_decay*params + params_grad);
            //   v = momentum2*v + (1-momentum2)*squared(weight_decay*params + params_grad);
            //   s = -alpha*m/(sqrt(v) + eps);
            auto pm = m.host();
            auto pv = v.host();
            auto ps = s.host_write_only();
            auto pparams = params.host();
            auto ppgrad = params_grad.host();
            for (size_t i = begin; i < end; ++i)
            {
                float g = weight_decay*pparams[i] + ppgrad[i];
                pm[i] = momentum1*pm[i] + (1-momentum1)*g;
                pv[i] = momentum2*pv[i] + (1-momentum2)*g*g;
                ps[i] = -alpha*pm[i]/(std::sqrt(pv[i]) + eps);
            }
        }